

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O1

void __thiscall
boost::python::
class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
def_maybe_overloads<AnalogConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
          (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
           *this,char *name,first_type fn,
          return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
          *a1,...)

{
  undefined8 in_R8;
  undefined1 local_91;
  long *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined1 local_28 [8];
  
  local_68 = local_28;
  local_40 = (char *)0x0;
  uStack_38 = 0;
  local_30 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_70 = in_R8;
  local_60 = local_68;
  local_58 = local_68;
  detail::
  make_function_aux<AnalogConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>,boost::mpl::vector4<AnalogConsumer_python*,PythonModuleClient&,unsigned_long,boost::python::list&>,mpl_::int_<0>>
            ((detail *)&local_90,fn,a1,in_R8,&local_91);
  objects::add_to_namespace((object *)this,name,(object *)&local_90,local_40);
  *local_90 = *local_90 + -1;
  if (*local_90 == 0) {
    _Py_Dealloc();
  }
  return;
}

Assistant:

void def_maybe_overloads(
        char const* name
        , Fn fn
        , A1 const& a1
        , ...)
    {
        this->def_impl(
            detail::unwrap_wrapper((W*)0)
          , name
          , fn
          , detail::def_helper<A1>(a1)
          , &fn
        );

    }